

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Node<QString,QMimeTypeXMLData>::emplaceValue<QMimeTypeXMLData_const&>
          (Node<QString,QMimeTypeXMLData> *this,QMimeTypeXMLData *args)

{
  Node<QString,QMimeTypeXMLData> NVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  QString *pQVar6;
  qsizetype qVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  QArrayData *data;
  QArrayData *pQVar10;
  undefined8 uVar11;
  QArrayData *pQVar12;
  undefined8 uVar13;
  long in_FS_OFFSET;
  Data *local_c8;
  QHash<QString,_QString> local_98;
  QArrayData *local_90;
  char16_t *pcStack_88;
  qsizetype local_80;
  QArrayData *local_78;
  char16_t *pcStack_70;
  qsizetype local_68;
  QArrayDataPointer<QString> local_60;
  QArrayDataPointer<QString> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  NVar1 = (Node<QString,QMimeTypeXMLData>)args->hasGlobDeleteAll;
  pDVar2 = (args->name).d.d;
  pcVar3 = (args->name).d.ptr;
  qVar4 = (args->name).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar5 = (args->localeComments).d;
  if ((pDVar5 != (Data *)0x0) && ((pDVar5->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)
     ) {
    LOCK();
    (pDVar5->ref).atomic._q_value.super___atomic_base<int>._M_i =
         (pDVar5->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_90 = &((args->genericIconName).d.d)->super_QArrayData;
  pcStack_88 = (args->genericIconName).d.ptr;
  local_80 = (args->genericIconName).d.size;
  if (local_90 != (QArrayData *)0x0) {
    LOCK();
    (((Data *)local_90)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_90)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78 = &((args->iconName).d.d)->super_QArrayData;
  pcStack_70 = (args->iconName).d.ptr;
  local_68 = (args->iconName).d.size;
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (((Data *)local_78)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_78)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_60.d = (args->globPatterns).d.d;
  pQVar6 = (args->globPatterns).d.ptr;
  qVar7 = (args->globPatterns).d.size;
  if (local_60.d == (Data *)0x0) {
    local_c8 = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_c8 = local_60.d;
  }
  this[0x18] = NVar1;
  data = *(QArrayData **)(this + 0x20);
  *(Data **)(this + 0x20) = pDVar2;
  *(char16_t **)(this + 0x28) = pcVar3;
  *(qsizetype *)(this + 0x30) = qVar4;
  local_98.d = (Data *)0x0;
  local_48.d = *(Data **)(this + 0x38);
  *(Data **)(this + 0x38) = pDVar5;
  local_60.ptr = pQVar6;
  local_60.size = qVar7;
  QHash<QString,_QString>::~QHash((QHash<QString,_QString> *)&local_48);
  pQVar10 = *(QArrayData **)(this + 0x40);
  uVar11 = *(undefined8 *)(this + 0x48);
  *(QArrayData **)(this + 0x40) = local_90;
  *(char16_t **)(this + 0x48) = pcStack_88;
  uVar8 = *(undefined8 *)(this + 0x50);
  *(qsizetype *)(this + 0x50) = local_80;
  pQVar12 = *(QArrayData **)(this + 0x58);
  uVar13 = *(undefined8 *)(this + 0x60);
  *(QArrayData **)(this + 0x58) = local_78;
  *(char16_t **)(this + 0x60) = pcStack_70;
  uVar9 = *(undefined8 *)(this + 0x68);
  *(qsizetype *)(this + 0x68) = local_68;
  local_60.size = 0;
  local_60.d = (Data *)0x0;
  local_60.ptr = (QString *)0x0;
  local_48.d = *(Data **)(this + 0x70);
  local_48.ptr = *(QString **)(this + 0x78);
  *(Data **)(this + 0x70) = local_c8;
  *(QString **)(this + 0x78) = pQVar6;
  local_48.size = *(qsizetype *)(this + 0x80);
  *(qsizetype *)(this + 0x80) = qVar7;
  local_90 = pQVar10;
  pcStack_88 = (char16_t *)uVar11;
  local_80 = uVar8;
  local_78 = pQVar12;
  pcStack_70 = (char16_t *)uVar13;
  local_68 = uVar9;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_60);
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,0x10);
    }
  }
  if (local_90 != (QArrayData *)0x0) {
    LOCK();
    (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_90,2,0x10);
    }
  }
  QHash<QString,_QString>::~QHash(&local_98);
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }